

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat_pixel_resize.cpp
# Opt level: O0

void ncnn::resize_bilinear_c2
               (uchar *src,int srcw,int srch,int srcstride,uchar *dst,int w,int h,int stride)

{
  short sVar1;
  short sVar2;
  undefined1 auVar3 [16];
  ulong uVar4;
  int *piVar5;
  byte *pbVar6;
  byte *pbVar7;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  long in_R8;
  int in_R9D;
  double dVar8;
  int in_stack_00000008;
  int in_stack_00000010;
  int remain;
  int nn;
  uchar *Dp;
  short *rows1p;
  short *rows0p;
  short b1_1;
  short b0_1;
  uchar *S1p_1;
  uchar *S0p;
  short a1_2;
  short a0_2;
  int dx_2;
  short *rows1p_2;
  short *rows0p_1;
  short *ialphap_1;
  uchar *S1_1;
  uchar *S0;
  short a1_1;
  short a0_1;
  uchar *S1p;
  int dx_1;
  short *rows1p_1;
  short *ialphap;
  uchar *S1;
  short *rows0_old;
  int dy_1;
  int prev_sy1;
  short *rows1;
  short *rows0;
  Mat rowsbuf1;
  Mat rowsbuf0;
  float b1;
  float b0;
  int dy;
  float a1;
  float a0;
  int dx;
  int sy;
  int sx;
  float fy;
  float fx;
  short *ibeta;
  short *ialpha;
  int *yofs;
  int *xofs;
  int *buf;
  double scale_y;
  double scale_x;
  int INTER_RESIZE_COEF_SCALE;
  int INTER_RESIZE_COEF_BITS;
  Allocator *in_stack_fffffffffffffd28;
  size_t in_stack_fffffffffffffd30;
  short **ppsVar9;
  Mat *in_stack_fffffffffffffd40;
  int local_2b8;
  undefined1 *local_2b0;
  short *local_2a8;
  short *local_2a0;
  int local_27c;
  short *local_278;
  short *local_270;
  short *local_268;
  int local_23c;
  short *local_238;
  short *local_230;
  int local_218;
  int local_214;
  short *local_210;
  short *local_208;
  Mat local_1f0;
  short *local_1a8;
  int *local_1a0;
  undefined8 local_198;
  undefined4 local_190;
  long *local_188;
  undefined4 local_180;
  undefined4 local_17c;
  undefined4 local_178;
  undefined4 local_174;
  undefined4 local_170;
  undefined8 local_168;
  int local_160 [3];
  int local_154 [3];
  float local_148;
  float local_144;
  int local_140;
  int local_13c [3];
  int local_130 [3];
  float local_124;
  float local_120;
  int local_11c;
  int local_118;
  int local_114;
  float local_110;
  float local_10c;
  short *local_108;
  short *local_100;
  void *local_f8;
  void *local_f0;
  void *local_e8;
  double local_e0;
  double local_d8;
  undefined4 local_cc;
  undefined4 local_c8;
  int local_c4;
  long local_c0;
  int local_b4;
  int local_b0;
  int local_ac;
  long local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  int local_8c;
  short **local_88;
  undefined8 local_80;
  undefined8 local_78;
  int local_6c;
  Mat *local_68;
  Mat *local_60;
  short **local_58;
  int local_38;
  undefined4 local_34;
  short **local_30;
  int local_28;
  undefined4 local_24;
  Mat *local_20;
  
  local_c8 = 0xb;
  local_cc = 0x800;
  local_d8 = (double)in_ESI / (double)in_R9D;
  local_e0 = (double)in_EDX / (double)in_stack_00000008;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = (long)(in_R9D * 2 + in_stack_00000008 * 2);
  uVar4 = SUB168(auVar3 * ZEXT816(4),0);
  if (SUB168(auVar3 * ZEXT816(4),8) != 0) {
    uVar4 = 0xffffffffffffffff;
  }
  local_c4 = in_R9D;
  local_c0 = in_R8;
  local_b4 = in_ECX;
  local_b0 = in_EDX;
  local_ac = in_ESI;
  local_a8 = in_RDI;
  local_f0 = operator_new__(uVar4);
  local_f8 = (void *)((long)local_f0 + (long)local_c4 * 4);
  local_100 = (short *)((long)local_f0 + (long)in_stack_00000008 * 4 + (long)local_c4 * 4);
  local_108 = (short *)((long)local_f0 +
                       (long)local_c4 * 4 + (long)in_stack_00000008 * 4 + (long)local_c4 * 4);
  local_e8 = local_f0;
  for (local_11c = 0; local_11c < local_c4; local_11c = local_11c + 1) {
    local_10c = (float)(((double)local_11c + 0.5) * local_d8 - 0.5);
    dVar8 = std::floor((double)(ulong)(uint)local_10c);
    local_114 = (int)SUB84(dVar8,0);
    local_10c = local_10c - (float)local_114;
    if (local_114 < 0) {
      local_114 = 0;
      local_10c = 0.0;
    }
    if (local_ac + -1 <= local_114) {
      local_114 = local_ac + -2;
      local_10c = 1.0;
    }
    *(int *)((long)local_f0 + (long)local_11c * 4) = local_114 << 1;
    local_120 = (1.0 - local_10c) * 2048.0;
    local_124 = local_10c * 2048.0;
    local_130[2] = (int)(local_120 +
                        (float)(~-(uint)(0.0 <= local_120) & 0xbf000000 |
                               -(uint)(0.0 <= local_120) & 0x3f000000));
    local_130[1] = 0xffff8000;
    piVar5 = std::max<int>(local_130 + 2,local_130 + 1);
    local_130[0] = 0x7fff;
    piVar5 = std::min<int>(piVar5,local_130);
    local_100[local_11c << 1] = (short)*piVar5;
    local_13c[2] = (int)(local_124 +
                        (float)(~-(uint)(0.0 <= local_124) & 0xbf000000 |
                               -(uint)(0.0 <= local_124) & 0x3f000000));
    local_13c[1] = 0xffff8000;
    piVar5 = std::max<int>(local_13c + 2,local_13c + 1);
    local_13c[0] = 0x7fff;
    piVar5 = std::min<int>(piVar5,local_13c);
    local_100[local_11c * 2 + 1] = (short)*piVar5;
  }
  for (local_140 = 0; local_140 < in_stack_00000008; local_140 = local_140 + 1) {
    local_110 = (float)(((double)local_140 + 0.5) * local_e0 - 0.5);
    dVar8 = std::floor((double)(ulong)(uint)local_110);
    local_118 = (int)SUB84(dVar8,0);
    local_110 = local_110 - (float)local_118;
    if (local_118 < 0) {
      local_118 = 0;
      local_110 = 0.0;
    }
    if (local_b0 + -1 <= local_118) {
      local_118 = local_b0 + -2;
      local_110 = 1.0;
    }
    *(int *)((long)local_f8 + (long)local_140 * 4) = local_118;
    local_144 = (1.0 - local_110) * 2048.0;
    local_148 = local_110 * 2048.0;
    local_154[2] = (int)(local_144 +
                        (float)(~-(uint)(0.0 <= local_144) & 0xbf000000 |
                               -(uint)(0.0 <= local_144) & 0x3f000000));
    local_154[1] = 0xffff8000;
    piVar5 = std::max<int>(local_154 + 2,local_154 + 1);
    local_154[0] = 0x7fff;
    piVar5 = std::min<int>(piVar5,local_154);
    local_108[local_140 << 1] = (short)*piVar5;
    local_160[2] = (int)(local_148 +
                        (float)(~-(uint)(0.0 <= local_148) & 0xbf000000 |
                               -(uint)(0.0 <= local_148) & 0x3f000000));
    local_160[1] = 0xffff8000;
    piVar5 = std::max<int>(local_160 + 2,local_160 + 1);
    local_160[0] = 0x7fff;
    piVar5 = std::min<int>(piVar5,local_160);
    local_108[local_140 * 2 + 1] = (short)*piVar5;
  }
  local_8c = local_c4 * 2 + 2;
  ppsVar9 = &local_1a8;
  local_98 = 2;
  local_a0 = 0;
  local_1a8 = (short *)0x0;
  local_1a0 = (int *)0x0;
  local_198 = 0;
  local_190 = 0;
  local_188 = (long *)0x0;
  local_180 = 0;
  local_17c = 0;
  local_178 = 0;
  local_174 = 0;
  local_170 = 0;
  local_168 = 0;
  local_88 = ppsVar9;
  Mat::create(in_stack_fffffffffffffd40,(int)((ulong)ppsVar9 >> 0x20),in_stack_fffffffffffffd30,
              in_stack_fffffffffffffd28);
  local_6c = local_c4 * 2 + 2;
  local_68 = &local_1f0;
  local_78 = 2;
  local_80 = 0;
  local_1f0.data = (short *)0x0;
  local_1f0.refcount = (int *)0x0;
  local_1f0.elemsize = 0;
  local_1f0.elempack = 0;
  local_1f0.allocator = (Allocator *)0x0;
  local_1f0.dims = 0;
  local_1f0.w = 0;
  local_1f0.h = 0;
  local_1f0.d = 0;
  local_1f0.c = 0;
  local_1f0.cstep = 0;
  Mat::create(local_68,(int)((ulong)ppsVar9 >> 0x20),in_stack_fffffffffffffd30,
              in_stack_fffffffffffffd28);
  local_208 = local_1a8;
  local_210 = (short *)local_1f0.data;
  local_214 = -2;
  for (local_218 = 0; local_238 = local_208, local_218 < in_stack_00000008;
      local_218 = local_218 + 1) {
    local_118 = *(int *)((long)local_f8 + (long)local_218 * 4);
    if (local_118 != local_214) {
      if (local_118 == local_214 + 1) {
        local_208 = local_210;
        local_210 = local_238;
        local_230 = local_100;
        for (local_23c = 0; local_23c < local_c4; local_23c = local_23c + 1) {
          local_114 = *(int *)((long)local_f0 + (long)local_23c * 4);
          pbVar6 = (byte *)(local_a8 + local_b4 * (local_118 + 1) + (long)local_114);
          sVar1 = *local_230;
          sVar2 = local_230[1];
          *local_238 = (short)((int)((uint)*pbVar6 * (int)sVar1 + (uint)pbVar6[2] * (int)sVar2) >> 4
                              );
          local_238[1] = (short)((int)((uint)pbVar6[1] * (int)sVar1 + (uint)pbVar6[3] * (int)sVar2)
                                >> 4);
          local_230 = local_230 + 2;
          local_238 = local_238 + 2;
        }
      }
      else {
        local_268 = local_100;
        local_270 = local_208;
        local_278 = local_210;
        for (local_27c = 0; local_27c < local_c4; local_27c = local_27c + 1) {
          local_114 = *(int *)((long)local_f0 + (long)local_27c * 4);
          sVar1 = *local_268;
          sVar2 = local_268[1];
          pbVar6 = (byte *)(local_a8 + local_b4 * local_118 + (long)local_114);
          pbVar7 = (byte *)(local_a8 + local_b4 * (local_118 + 1) + (long)local_114);
          *local_270 = (short)((int)((uint)*pbVar6 * (int)sVar1 + (uint)pbVar6[2] * (int)sVar2) >> 4
                              );
          local_270[1] = (short)((int)((uint)pbVar6[1] * (int)sVar1 + (uint)pbVar6[3] * (int)sVar2)
                                >> 4);
          *local_278 = (short)((int)((uint)*pbVar7 * (int)sVar1 + (uint)pbVar7[2] * (int)sVar2) >> 4
                              );
          local_278[1] = (short)((int)((uint)pbVar7[1] * (int)sVar1 + (uint)pbVar7[3] * (int)sVar2)
                                >> 4);
          local_268 = local_268 + 2;
          local_270 = local_270 + 2;
          local_278 = local_278 + 2;
        }
      }
    }
    sVar1 = *local_108;
    sVar2 = local_108[1];
    local_2a0 = local_208;
    local_2a8 = local_210;
    local_2b0 = (undefined1 *)(local_c0 + in_stack_00000010 * local_218);
    for (local_2b8 = local_c4 * 2; local_2b8 != 0; local_2b8 = local_2b8 + -1) {
      *local_2b0 = (char)((int)(short)((uint)((int)sVar1 * (int)*local_2a0) >> 0x10) +
                          (int)(short)((uint)((int)sVar2 * (int)*local_2a8) >> 0x10) + 2 >> 2);
      local_2b0 = local_2b0 + 1;
      local_2a8 = local_2a8 + 1;
      local_2a0 = local_2a0 + 1;
    }
    local_108 = local_108 + 2;
    local_214 = local_118;
  }
  if (local_e8 != (void *)0x0) {
    operator_delete__(local_e8);
  }
  local_60 = &local_1f0;
  local_20 = local_60;
  if (local_1f0.refcount != (int *)0x0) {
    local_24 = 0xffffffff;
    LOCK();
    local_28 = *local_1f0.refcount;
    *local_1f0.refcount = *local_1f0.refcount + -1;
    UNLOCK();
    if (local_28 == 1) {
      if (local_1f0.allocator == (Allocator *)0x0) {
        if ((short *)local_1f0.data != (short *)0x0) {
          free(local_1f0.data);
        }
      }
      else {
        (*(local_1f0.allocator)->_vptr_Allocator[3])(local_1f0.allocator,local_1f0.data);
      }
    }
  }
  local_1f0.elemsize = 0;
  local_1f0.elempack = 0;
  local_1f0.dims = 0;
  local_1f0.w = 0;
  local_1f0.h = 0;
  local_1f0.d = 0;
  local_1f0.c = 0;
  local_1f0.cstep = 0;
  local_1f0.refcount = (int *)0x0;
  local_58 = &local_1a8;
  if (local_1a0 != (int *)0x0) {
    local_34 = 0xffffffff;
    LOCK();
    local_38 = *local_1a0;
    *local_1a0 = *local_1a0 + -1;
    UNLOCK();
    if (local_38 == 1) {
      local_30 = local_58;
      if (local_188 == (long *)0x0) {
        if (local_1a8 != (short *)0x0) {
          free(local_1a8);
        }
      }
      else {
        (**(code **)(*local_188 + 0x18))(local_188,local_1a8);
      }
    }
  }
  return;
}

Assistant:

void resize_bilinear_c2(const unsigned char* src, int srcw, int srch, int srcstride, unsigned char* dst, int w, int h, int stride)
{
    const int INTER_RESIZE_COEF_BITS = 11;
    const int INTER_RESIZE_COEF_SCALE = 1 << INTER_RESIZE_COEF_BITS;
    //     const int ONE=INTER_RESIZE_COEF_SCALE;

    double scale_x = (double)srcw / w;
    double scale_y = (double)srch / h;

    int* buf = new int[w + h + w + h];

    int* xofs = buf;     //new int[w];
    int* yofs = buf + w; //new int[h];

    short* ialpha = (short*)(buf + w + h);    //new short[w * 2];
    short* ibeta = (short*)(buf + w + h + w); //new short[h * 2];

    float fx;
    float fy;
    int sx;
    int sy;

#define SATURATE_CAST_SHORT(X) (short)::std::min(::std::max((int)(X + (X >= 0.f ? 0.5f : -0.5f)), SHRT_MIN), SHRT_MAX);

    for (int dx = 0; dx < w; dx++)
    {
        fx = (float)((dx + 0.5) * scale_x - 0.5);
        sx = static_cast<int>(floor(fx));
        fx -= sx;

        if (sx < 0)
        {
            sx = 0;
            fx = 0.f;
        }
        if (sx >= srcw - 1)
        {
            sx = srcw - 2;
            fx = 1.f;
        }

        xofs[dx] = sx * 2;

        float a0 = (1.f - fx) * INTER_RESIZE_COEF_SCALE;
        float a1 = fx * INTER_RESIZE_COEF_SCALE;

        ialpha[dx * 2] = SATURATE_CAST_SHORT(a0);
        ialpha[dx * 2 + 1] = SATURATE_CAST_SHORT(a1);
    }

    for (int dy = 0; dy < h; dy++)
    {
        fy = (float)((dy + 0.5) * scale_y - 0.5);
        sy = static_cast<int>(floor(fy));
        fy -= sy;

        if (sy < 0)
        {
            sy = 0;
            fy = 0.f;
        }
        if (sy >= srch - 1)
        {
            sy = srch - 2;
            fy = 1.f;
        }

        yofs[dy] = sy;

        float b0 = (1.f - fy) * INTER_RESIZE_COEF_SCALE;
        float b1 = fy * INTER_RESIZE_COEF_SCALE;

        ibeta[dy * 2] = SATURATE_CAST_SHORT(b0);
        ibeta[dy * 2 + 1] = SATURATE_CAST_SHORT(b1);
    }

#undef SATURATE_CAST_SHORT

    // loop body
    Mat rowsbuf0(w * 2 + 2, (size_t)2u);
    Mat rowsbuf1(w * 2 + 2, (size_t)2u);
    short* rows0 = (short*)rowsbuf0.data;
    short* rows1 = (short*)rowsbuf1.data;

    int prev_sy1 = -2;

    for (int dy = 0; dy < h; dy++)
    {
        sy = yofs[dy];

        if (sy == prev_sy1)
        {
            // reuse all rows
        }
        else if (sy == prev_sy1 + 1)
        {
            // hresize one row
            short* rows0_old = rows0;
            rows0 = rows1;
            rows1 = rows0_old;
            const unsigned char* S1 = src + srcstride * (sy + 1);

            const short* ialphap = ialpha;
            short* rows1p = rows1;
            for (int dx = 0; dx < w; dx++)
            {
                sx = xofs[dx];

                const unsigned char* S1p = S1 + sx;
#if __ARM_NEON
                int16x4_t _a0a1XX = vld1_s16(ialphap);
                int16x4_t _a0a0a1a1 = vzip_s16(_a0a1XX, _a0a1XX).val[0];
                uint8x8_t _S1 = uint8x8_t();

                _S1 = vld1_lane_u8(S1p, _S1, 0);
                _S1 = vld1_lane_u8(S1p + 1, _S1, 1);
                _S1 = vld1_lane_u8(S1p + 2, _S1, 2);
                _S1 = vld1_lane_u8(S1p + 3, _S1, 3);

                int16x8_t _S116 = vreinterpretq_s16_u16(vmovl_u8(_S1));
                int16x4_t _S1lowhigh = vget_low_s16(_S116);
                int32x4_t _S1ma0a1 = vmull_s16(_S1lowhigh, _a0a0a1a1);
                int32x2_t _rows1low = vadd_s32(vget_low_s32(_S1ma0a1), vget_high_s32(_S1ma0a1));
                int32x4_t _rows1 = vcombine_s32(_rows1low, vget_high_s32(_S1ma0a1));
                int16x4_t _rows1_sr4 = vshrn_n_s32(_rows1, 4);
                vst1_s16(rows1p, _rows1_sr4);
#else
                short a0 = ialphap[0];
                short a1 = ialphap[1];

                rows1p[0] = (S1p[0] * a0 + S1p[2] * a1) >> 4;
                rows1p[1] = (S1p[1] * a0 + S1p[3] * a1) >> 4;
#endif // __ARM_NEON

                ialphap += 2;
                rows1p += 2;
            }
        }
        else
        {
            // hresize two rows
            const unsigned char* S0 = src + srcstride * (sy);
            const unsigned char* S1 = src + srcstride * (sy + 1);

            const short* ialphap = ialpha;
            short* rows0p = rows0;
            short* rows1p = rows1;
            for (int dx = 0; dx < w; dx++)
            {
                sx = xofs[dx];
                short a0 = ialphap[0];
                short a1 = ialphap[1];

                const unsigned char* S0p = S0 + sx;
                const unsigned char* S1p = S1 + sx;
#if __ARM_NEON
                int16x4_t _a0 = vdup_n_s16(a0);
                int16x4_t _a1 = vdup_n_s16(a1);
                uint8x8_t _S0 = uint8x8_t();
                uint8x8_t _S1 = uint8x8_t();

                _S0 = vld1_lane_u8(S0p, _S0, 0);
                _S0 = vld1_lane_u8(S0p + 1, _S0, 1);
                _S0 = vld1_lane_u8(S0p + 2, _S0, 2);
                _S0 = vld1_lane_u8(S0p + 3, _S0, 3);

                _S1 = vld1_lane_u8(S1p, _S1, 0);
                _S1 = vld1_lane_u8(S1p + 1, _S1, 1);
                _S1 = vld1_lane_u8(S1p + 2, _S1, 2);
                _S1 = vld1_lane_u8(S1p + 3, _S1, 3);

                int16x8_t _S016 = vreinterpretq_s16_u16(vmovl_u8(_S0));
                int16x8_t _S116 = vreinterpretq_s16_u16(vmovl_u8(_S1));
                int16x4_t _S0lowhigh = vget_low_s16(_S016);
                int16x4_t _S1lowhigh = vget_low_s16(_S116);
                int32x2x2_t _S0S1low_S0S1high = vtrn_s32(vreinterpret_s32_s16(_S0lowhigh), vreinterpret_s32_s16(_S1lowhigh));
                int32x4_t _rows01 = vmull_s16(vreinterpret_s16_s32(_S0S1low_S0S1high.val[0]), _a0);
                _rows01 = vmlal_s16(_rows01, vreinterpret_s16_s32(_S0S1low_S0S1high.val[1]), _a1);
                int16x4_t _rows01_sr4 = vshrn_n_s32(_rows01, 4);
                int16x4_t _rows1_sr4 = vext_s16(_rows01_sr4, _rows01_sr4, 2);
                vst1_s16(rows0p, _rows01_sr4);
                vst1_s16(rows1p, _rows1_sr4);
#else
                rows0p[0] = (S0p[0] * a0 + S0p[2] * a1) >> 4;
                rows0p[1] = (S0p[1] * a0 + S0p[3] * a1) >> 4;
                rows1p[0] = (S1p[0] * a0 + S1p[2] * a1) >> 4;
                rows1p[1] = (S1p[1] * a0 + S1p[3] * a1) >> 4;
#endif // __ARM_NEON

                ialphap += 2;
                rows0p += 2;
                rows1p += 2;
            }
        }

        prev_sy1 = sy;

        // vresize
        short b0 = ibeta[0];
        short b1 = ibeta[1];

        short* rows0p = rows0;
        short* rows1p = rows1;
        unsigned char* Dp = dst + stride * (dy);

#if __ARM_NEON
        int nn = (w * 2) >> 3;
#else
        int nn = 0;
#endif
        int remain = (w * 2) - (nn << 3);

#if __ARM_NEON
#if __aarch64__
        int16x4_t _b0 = vdup_n_s16(b0);
        int16x4_t _b1 = vdup_n_s16(b1);
        int32x4_t _v2 = vdupq_n_s32(2);
        for (; nn > 0; nn--)
        {
            int16x4_t _rows0p_sr4 = vld1_s16(rows0p);
            int16x4_t _rows1p_sr4 = vld1_s16(rows1p);
            int16x4_t _rows0p_1_sr4 = vld1_s16(rows0p + 4);
            int16x4_t _rows1p_1_sr4 = vld1_s16(rows1p + 4);

            int32x4_t _rows0p_sr4_mb0 = vmull_s16(_rows0p_sr4, _b0);
            int32x4_t _rows1p_sr4_mb1 = vmull_s16(_rows1p_sr4, _b1);
            int32x4_t _rows0p_1_sr4_mb0 = vmull_s16(_rows0p_1_sr4, _b0);
            int32x4_t _rows1p_1_sr4_mb1 = vmull_s16(_rows1p_1_sr4, _b1);

            int32x4_t _acc = _v2;
            _acc = vsraq_n_s32(_acc, _rows0p_sr4_mb0, 16);
            _acc = vsraq_n_s32(_acc, _rows1p_sr4_mb1, 16);

            int32x4_t _acc_1 = _v2;
            _acc_1 = vsraq_n_s32(_acc_1, _rows0p_1_sr4_mb0, 16);
            _acc_1 = vsraq_n_s32(_acc_1, _rows1p_1_sr4_mb1, 16);

            int16x4_t _acc16 = vshrn_n_s32(_acc, 2);
            int16x4_t _acc16_1 = vshrn_n_s32(_acc_1, 2);

            uint8x8_t _D = vqmovun_s16(vcombine_s16(_acc16, _acc16_1));

            vst1_u8(Dp, _D);

            Dp += 8;
            rows0p += 8;
            rows1p += 8;
        }
#else
        if (nn > 0)
        {
            asm volatile(
                "vdup.s16   d16, %8         \n"
                "mov        r4, #2          \n"
                "vdup.s16   d17, %9         \n"
                "vdup.s32   q12, r4         \n"
                "pld        [%0, #128]      \n"
                "vld1.s16   {d2-d3}, [%0 :128]!\n"
                "pld        [%1, #128]      \n"
                "vld1.s16   {d6-d7}, [%1 :128]!\n"
                "0:                         \n"
                "vmull.s16  q0, d2, d16     \n"
                "vmull.s16  q1, d3, d16     \n"
                "vorr.s32   q10, q12, q12   \n"
                "vorr.s32   q11, q12, q12   \n"
                "vmull.s16  q2, d6, d17     \n"
                "vmull.s16  q3, d7, d17     \n"
                "vsra.s32   q10, q0, #16    \n"
                "vsra.s32   q11, q1, #16    \n"
                "pld        [%0, #128]      \n"
                "vld1.s16   {d2-d3}, [%0 :128]!\n"
                "vsra.s32   q10, q2, #16    \n"
                "vsra.s32   q11, q3, #16    \n"
                "pld        [%1, #128]      \n"
                "vld1.s16   {d6-d7}, [%1 :128]!\n"
                "vshrn.s32  d20, q10, #2    \n"
                "vshrn.s32  d21, q11, #2    \n"
                "vqmovun.s16 d20, q10        \n"
                "vst1.8     {d20}, [%2]!    \n"
                "subs       %3, #1          \n"
                "bne        0b              \n"
                "sub        %0, #16         \n"
                "sub        %1, #16         \n"
                : "=r"(rows0p), // %0
                "=r"(rows1p), // %1
                "=r"(Dp),     // %2
                "=r"(nn)      // %3
                : "0"(rows0p),
                "1"(rows1p),
                "2"(Dp),
                "3"(nn),
                "r"(b0), // %8
                "r"(b1)  // %9
                : "cc", "memory", "r4", "q0", "q1", "q2", "q3", "q8", "q9", "q10", "q11", "q12");
        }
#endif // __aarch64__
#endif // __ARM_NEON
        for (; remain; --remain)
        {
            //             D[x] = (rows0[x]*b0 + rows1[x]*b1) >> INTER_RESIZE_COEF_BITS;
            *Dp++ = (unsigned char)(((short)((b0 * (short)(*rows0p++)) >> 16) + (short)((b1 * (short)(*rows1p++)) >> 16) + 2) >> 2);
        }

        ibeta += 2;
    }

    delete[] buf;
}